

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O0

void WebRtcIsac_UpdateRateModel(RateModel *State,int StreamSize,int FrameSamples,double BottleNeck)

{
  double TransmissionTime;
  double BottleNeck_local;
  int FrameSamples_local;
  int StreamSize_local;
  RateModel *State_local;
  
  State->InitCounter = 0;
  State->StillBuffered = ((double)StreamSize * 8.0 * 1000.0) / BottleNeck + State->StillBuffered;
  State->StillBuffered = State->StillBuffered - (double)((FrameSamples * 1000) / 16000);
  if (State->StillBuffered <= 0.0 && State->StillBuffered != 0.0) {
    State->StillBuffered = 0.0;
  }
  return;
}

Assistant:

void WebRtcIsac_UpdateRateModel(
    RateModel *State,
    int StreamSize,                    /* bytes in bitstream */
    const int FrameSamples,            /* samples per frame */
    const double BottleNeck)        /* bottle neck rate; excl headers (bps) */
{
  double TransmissionTime;

  /* avoid the initial "high-rate" burst */
  State->InitCounter = 0;

  /* Update buffer delay */
  TransmissionTime = StreamSize * 8.0 * 1000.0 / BottleNeck;  /* ms */
  State->StillBuffered += TransmissionTime;
  State->StillBuffered -= (FrameSamples * 1000) / FS;     /* ms */
  if (State->StillBuffered < 0.0)
    State->StillBuffered = 0.0;

}